

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O1

void Imf_3_2::anon_unknown_9::dctInverse8x8_scalar<4>(float *data)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  
  fVar6 = data[1];
  fVar8 = data[3];
  fVar28 = data[2] * 0.19134216 - data[6] * 0.46193984;
  fVar30 = data[10] * 0.19134216 - data[0xe] * 0.46193984;
  fVar32 = data[0x12] * 0.19134216 - data[0x16] * 0.46193984;
  fVar34 = data[0x1a] * 0.19134216 - data[0x1e] * 0.46193984;
  fVar14 = data[6] * 0.19134216 + data[2] * 0.46193984;
  fVar16 = data[0xe] * 0.19134216 + data[10] * 0.46193984;
  fVar17 = data[0x16] * 0.19134216 + data[0x12] * 0.46193984;
  fVar18 = data[0x1e] * 0.19134216 + data[0x1a] * 0.46193984;
  fVar4 = data[0x19];
  fVar10 = data[0x11];
  fVar11 = data[9];
  fVar13 = data[0x1b];
  fVar12 = data[0x13];
  fVar24 = data[0xb];
  fVar15 = data[0x1d];
  fVar25 = data[0x15];
  fVar26 = data[0xd];
  fVar27 = data[5];
  fVar20 = data[0x1f];
  fVar29 = data[0x17];
  fVar31 = data[0xf];
  fVar33 = data[7];
  fVar5 = fVar33 * 0.097545706 + fVar27 * 0.27778545 + fVar6 * 0.49039266 + fVar8 * 0.41573495;
  fVar7 = fVar31 * 0.097545706 + fVar26 * 0.27778545 + fVar11 * 0.49039266 + fVar24 * 0.41573495;
  fVar9 = fVar29 * 0.097545706 + fVar25 * 0.27778545 + fVar10 * 0.49039266 + fVar12 * 0.41573495;
  fVar39 = fVar33 * -0.27778545 + fVar27 * -0.49039266 + fVar6 * 0.41573495 + fVar8 * -0.097545706;
  fVar40 = fVar31 * -0.27778545 + fVar26 * -0.49039266 + fVar11 * 0.41573495 + fVar24 * -0.097545706
  ;
  fVar41 = fVar29 * -0.27778545 + fVar25 * -0.49039266 + fVar10 * 0.41573495 + fVar12 * -0.097545706
  ;
  fVar42 = fVar20 * -0.27778545 + fVar15 * -0.49039266 + fVar4 * 0.41573495 + fVar13 * -0.097545706;
  fVar19 = fVar33 * 0.41573495 + fVar27 * 0.097545706 + fVar6 * 0.27778545 + fVar8 * -0.49039266;
  fVar21 = fVar31 * 0.41573495 + fVar26 * 0.097545706 + fVar11 * 0.27778545 + fVar24 * -0.49039266;
  fVar22 = fVar29 * 0.41573495 + fVar25 * 0.097545706 + fVar10 * 0.27778545 + fVar12 * -0.49039266;
  fVar23 = fVar20 * 0.41573495 + fVar15 * 0.097545706 + fVar4 * 0.27778545 + fVar13 * -0.49039266;
  fVar35 = fVar33 * -0.49039266 + fVar27 * 0.41573495 + fVar6 * 0.097545706 + fVar8 * -0.27778545;
  fVar36 = fVar31 * -0.49039266 + fVar26 * 0.41573495 + fVar11 * 0.097545706 + fVar24 * -0.27778545;
  fVar37 = fVar29 * -0.49039266 + fVar25 * 0.41573495 + fVar10 * 0.097545706 + fVar12 * -0.27778545;
  fVar38 = fVar20 * -0.49039266 + fVar15 * 0.41573495 + fVar4 * 0.097545706 + fVar13 * -0.27778545;
  fVar24 = (*data - data[4]) * 0.35355362;
  fVar25 = (data[8] - data[0xc]) * 0.35355362;
  fVar26 = (data[0x10] - data[0x14]) * 0.35355362;
  fVar27 = (data[0x18] - data[0x1c]) * 0.35355362;
  fVar43 = fVar28 + fVar24;
  fVar44 = fVar30 + fVar25;
  fVar45 = fVar32 + fVar26;
  fVar46 = fVar34 + fVar27;
  fVar24 = fVar24 - fVar28;
  fVar25 = fVar25 - fVar30;
  fVar26 = fVar26 - fVar32;
  fVar27 = fVar27 - fVar34;
  fVar6 = (*data + data[4]) * 0.35355362;
  fVar8 = (data[8] + data[0xc]) * 0.35355362;
  fVar10 = (data[0x10] + data[0x14]) * 0.35355362;
  fVar11 = (data[0x18] + data[0x1c]) * 0.35355362;
  fVar29 = fVar14 + fVar6;
  fVar31 = fVar16 + fVar8;
  fVar33 = fVar17 + fVar10;
  fVar6 = fVar6 - fVar14;
  fVar8 = fVar8 - fVar16;
  fVar10 = fVar10 - fVar17;
  fVar12 = fVar11 - fVar18;
  fVar14 = fVar7 + fVar31;
  data[0x1c] = fVar12 - fVar38;
  data[0x1d] = fVar27 - fVar23;
  data[0x1e] = fVar46 - fVar42;
  data[0x1f] = (fVar18 + fVar11) -
               (fVar20 * 0.097545706 +
               fVar15 * 0.27778545 + fVar4 * 0.49039266 + fVar13 * 0.41573495);
  data[0x18] = fVar14;
  data[0x19] = fVar42 + fVar46;
  data[0x1a] = fVar23 + fVar27;
  data[0x1b] = fVar38 + fVar12;
  data[0x14] = fVar10 - fVar37;
  data[0x15] = fVar26 - fVar22;
  data[0x16] = fVar45 - fVar41;
  data[0x17] = fVar33 - fVar9;
  data[0x10] = fVar9 + fVar33;
  data[0x11] = fVar41 + fVar45;
  data[0x12] = fVar22 + fVar26;
  data[0x13] = fVar37 + fVar10;
  data[0xc] = fVar8 - fVar36;
  data[0xd] = fVar25 - fVar21;
  data[0xe] = fVar44 - fVar40;
  data[0xf] = fVar31 - fVar7;
  data[8] = fVar14;
  data[9] = fVar40 + fVar44;
  data[10] = fVar21 + fVar25;
  data[0xb] = fVar36 + fVar8;
  *(ulong *)(data + 4) = CONCAT44(fVar24 - fVar19,fVar6 - fVar35);
  *(ulong *)(data + 6) = CONCAT44(fVar29 - fVar5,fVar43 - fVar39);
  *(ulong *)data = CONCAT44(fVar39 + fVar43,fVar5 + fVar29);
  *(ulong *)(data + 2) = CONCAT44(fVar35 + fVar6,fVar19 + fVar24);
  lVar3 = -8;
  do {
    pfVar1 = data + lVar3 + 0x10;
    fVar6 = *pfVar1;
    fVar8 = pfVar1[1];
    fVar4 = pfVar1[2];
    fVar10 = pfVar1[3];
    pfVar1 = data + lVar3 + 0x18;
    pfVar2 = data + lVar3 + 0x20;
    fVar11 = *pfVar2;
    fVar13 = pfVar2[1];
    fVar12 = pfVar2[2];
    fVar24 = pfVar2[3];
    pfVar2 = data + lVar3 + 0x38;
    fVar21 = *pfVar1 * 0.19134216 - *pfVar2 * 0.46193984;
    fVar22 = pfVar1[1] * 0.19134216 - pfVar2[1] * 0.46193984;
    fVar23 = pfVar1[2] * 0.19134216 - pfVar2[2] * 0.46193984;
    fVar28 = pfVar1[3] * 0.19134216 - pfVar2[3] * 0.46193984;
    fVar30 = *pfVar2 * 0.19134216 + *pfVar1 * 0.46193984;
    fVar32 = pfVar2[1] * 0.19134216 + pfVar1[1] * 0.46193984;
    fVar34 = pfVar2[2] * 0.19134216 + pfVar1[2] * 0.46193984;
    fVar35 = pfVar2[3] * 0.19134216 + pfVar1[3] * 0.46193984;
    pfVar1 = data + lVar3 + 0x30;
    fVar15 = *pfVar1;
    fVar25 = pfVar1[1];
    fVar26 = pfVar1[2];
    fVar27 = pfVar1[3];
    pfVar1 = data + lVar3 + 0x40;
    fVar20 = *pfVar1;
    fVar29 = pfVar1[1];
    fVar31 = pfVar1[2];
    fVar33 = pfVar1[3];
    fVar16 = fVar20 * 0.097545706 + fVar15 * 0.27778545 + fVar6 * 0.49039266 + fVar11 * 0.41573495;
    fVar17 = fVar29 * 0.097545706 + fVar25 * 0.27778545 + fVar8 * 0.49039266 + fVar13 * 0.41573495;
    fVar18 = fVar31 * 0.097545706 + fVar26 * 0.27778545 + fVar4 * 0.49039266 + fVar12 * 0.41573495;
    fVar19 = fVar33 * 0.097545706 + fVar27 * 0.27778545 + fVar10 * 0.49039266 + fVar24 * 0.41573495;
    fVar40 = fVar20 * -0.27778545 +
             fVar15 * -0.49039266 + fVar6 * 0.41573495 + fVar11 * -0.097545706;
    fVar41 = fVar29 * -0.27778545 +
             fVar25 * -0.49039266 + fVar8 * 0.41573495 + fVar13 * -0.097545706;
    fVar42 = fVar31 * -0.27778545 +
             fVar26 * -0.49039266 + fVar4 * 0.41573495 + fVar12 * -0.097545706;
    fVar43 = fVar33 * -0.27778545 +
             fVar27 * -0.49039266 + fVar10 * 0.41573495 + fVar24 * -0.097545706;
    fVar5 = fVar20 * 0.41573495 + fVar15 * 0.097545706 + fVar6 * 0.27778545 + fVar11 * -0.49039266;
    fVar7 = fVar29 * 0.41573495 + fVar25 * 0.097545706 + fVar8 * 0.27778545 + fVar13 * -0.49039266;
    fVar9 = fVar31 * 0.41573495 + fVar26 * 0.097545706 + fVar4 * 0.27778545 + fVar12 * -0.49039266;
    fVar14 = fVar33 * 0.41573495 + fVar27 * 0.097545706 + fVar10 * 0.27778545 + fVar24 * -0.49039266
    ;
    pfVar1 = data + lVar3 + 8;
    fVar36 = fVar20 * -0.49039266 + fVar15 * 0.41573495 + fVar6 * 0.097545706 + fVar11 * -0.27778545
    ;
    fVar37 = fVar29 * -0.49039266 + fVar25 * 0.41573495 + fVar8 * 0.097545706 + fVar13 * -0.27778545
    ;
    fVar38 = fVar31 * -0.49039266 + fVar26 * 0.41573495 + fVar4 * 0.097545706 + fVar12 * -0.27778545
    ;
    fVar39 = fVar33 * -0.49039266 +
             fVar27 * 0.41573495 + fVar10 * 0.097545706 + fVar24 * -0.27778545;
    pfVar2 = data + lVar3 + 0x28;
    fVar15 = (*pfVar1 + *pfVar2) * 0.35355362;
    fVar25 = (pfVar1[1] + pfVar2[1]) * 0.35355362;
    fVar26 = (pfVar1[2] + pfVar2[2]) * 0.35355362;
    fVar27 = (pfVar1[3] + pfVar2[3]) * 0.35355362;
    fVar6 = (*pfVar1 - *pfVar2) * 0.35355362;
    fVar8 = (pfVar1[1] - pfVar2[1]) * 0.35355362;
    fVar4 = (pfVar1[2] - pfVar2[2]) * 0.35355362;
    fVar10 = (pfVar1[3] - pfVar2[3]) * 0.35355362;
    fVar11 = fVar21 + fVar6;
    fVar13 = fVar22 + fVar8;
    fVar12 = fVar23 + fVar4;
    fVar24 = fVar28 + fVar10;
    fVar6 = fVar6 - fVar21;
    fVar8 = fVar8 - fVar22;
    fVar4 = fVar4 - fVar23;
    fVar10 = fVar10 - fVar28;
    fVar20 = fVar30 + fVar15;
    fVar29 = fVar32 + fVar25;
    fVar31 = fVar34 + fVar26;
    fVar33 = fVar35 + fVar27;
    fVar15 = fVar15 - fVar30;
    fVar25 = fVar25 - fVar32;
    fVar26 = fVar26 - fVar34;
    fVar27 = fVar27 - fVar35;
    pfVar1 = data + lVar3 + 8;
    *pfVar1 = fVar16 + fVar20;
    pfVar1[1] = fVar17 + fVar29;
    pfVar1[2] = fVar18 + fVar31;
    pfVar1[3] = fVar19 + fVar33;
    pfVar1 = data + lVar3 + 0x10;
    *pfVar1 = fVar40 + fVar11;
    pfVar1[1] = fVar41 + fVar13;
    pfVar1[2] = fVar42 + fVar12;
    pfVar1[3] = fVar43 + fVar24;
    pfVar1 = data + lVar3 + 0x18;
    *pfVar1 = fVar5 + fVar6;
    pfVar1[1] = fVar7 + fVar8;
    pfVar1[2] = fVar9 + fVar4;
    pfVar1[3] = fVar14 + fVar10;
    pfVar1 = data + lVar3 + 0x20;
    *pfVar1 = fVar36 + fVar15;
    pfVar1[1] = fVar37 + fVar25;
    pfVar1[2] = fVar38 + fVar26;
    pfVar1[3] = fVar39 + fVar27;
    pfVar1 = data + lVar3 + 0x28;
    *pfVar1 = fVar15 - fVar36;
    pfVar1[1] = fVar25 - fVar37;
    pfVar1[2] = fVar26 - fVar38;
    pfVar1[3] = fVar27 - fVar39;
    pfVar1 = data + lVar3 + 0x30;
    *pfVar1 = fVar6 - fVar5;
    pfVar1[1] = fVar8 - fVar7;
    pfVar1[2] = fVar4 - fVar9;
    pfVar1[3] = fVar10 - fVar14;
    pfVar1 = data + lVar3 + 0x38;
    *pfVar1 = fVar11 - fVar40;
    pfVar1[1] = fVar13 - fVar41;
    pfVar1[2] = fVar12 - fVar42;
    pfVar1[3] = fVar24 - fVar43;
    pfVar1 = data + lVar3 + 0x40;
    *pfVar1 = fVar20 - fVar16;
    pfVar1[1] = fVar29 - fVar17;
    pfVar1[2] = fVar31 - fVar18;
    pfVar1[3] = fVar33 - fVar19;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0);
  return;
}

Assistant:

void
dctInverse8x8_scalar (float* data)
{
    const float a = .5f * cosf (3.14159f / 4.0f);
    const float b = .5f * cosf (3.14159f / 16.0f);
    const float c = .5f * cosf (3.14159f / 8.0f);
    const float d = .5f * cosf (3.f * 3.14159f / 16.0f);
    const float e = .5f * cosf (5.f * 3.14159f / 16.0f);
    const float f = .5f * cosf (3.f * 3.14159f / 8.0f);
    const float g = .5f * cosf (7.f * 3.14159f / 16.0f);

    float alpha[4], beta[4], theta[4], gamma[4];

    float* rowPtr = NULL;

    //
    // First pass - row wise.
    //
    // This looks less-compact than the description above in
    // an attempt to fold together common sub-expressions.
    //

    for (int row = 0; row < 8 - zeroedRows; ++row)
    {
        rowPtr = data + row * 8;

        alpha[0] = c * rowPtr[2];
        alpha[1] = f * rowPtr[2];
        alpha[2] = c * rowPtr[6];
        alpha[3] = f * rowPtr[6];

        beta[0] = b * rowPtr[1] + d * rowPtr[3] + e * rowPtr[5] + g * rowPtr[7];
        beta[1] = d * rowPtr[1] - g * rowPtr[3] - b * rowPtr[5] - e * rowPtr[7];
        beta[2] = e * rowPtr[1] - b * rowPtr[3] + g * rowPtr[5] + d * rowPtr[7];
        beta[3] = g * rowPtr[1] - e * rowPtr[3] + d * rowPtr[5] - b * rowPtr[7];

        theta[0] = a * (rowPtr[0] + rowPtr[4]);
        theta[3] = a * (rowPtr[0] - rowPtr[4]);

        theta[1] = alpha[0] + alpha[3];
        theta[2] = alpha[1] - alpha[2];

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        rowPtr[0] = gamma[0] + beta[0];
        rowPtr[1] = gamma[1] + beta[1];
        rowPtr[2] = gamma[2] + beta[2];
        rowPtr[3] = gamma[3] + beta[3];

        rowPtr[4] = gamma[3] - beta[3];
        rowPtr[5] = gamma[2] - beta[2];
        rowPtr[6] = gamma[1] - beta[1];
        rowPtr[7] = gamma[0] - beta[0];
    }

    //
    // Second pass - column wise.
    //

    for (int column = 0; column < 8; ++column)
    {
        alpha[0] = c * data[16 + column];
        alpha[1] = f * data[16 + column];
        alpha[2] = c * data[48 + column];
        alpha[3] = f * data[48 + column];

        beta[0] = b * data[8 + column] + d * data[24 + column] +
                  e * data[40 + column] + g * data[56 + column];

        beta[1] = d * data[8 + column] - g * data[24 + column] -
                  b * data[40 + column] - e * data[56 + column];

        beta[2] = e * data[8 + column] - b * data[24 + column] +
                  g * data[40 + column] + d * data[56 + column];

        beta[3] = g * data[8 + column] - e * data[24 + column] +
                  d * data[40 + column] - b * data[56 + column];

        theta[0] = a * (data[column] + data[32 + column]);
        theta[3] = a * (data[column] - data[32 + column]);

        theta[1] = alpha[0] + alpha[3];
        theta[2] = alpha[1] - alpha[2];

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        data[column]      = gamma[0] + beta[0];
        data[8 + column]  = gamma[1] + beta[1];
        data[16 + column] = gamma[2] + beta[2];
        data[24 + column] = gamma[3] + beta[3];

        data[32 + column] = gamma[3] - beta[3];
        data[40 + column] = gamma[2] - beta[2];
        data[48 + column] = gamma[1] - beta[1];
        data[56 + column] = gamma[0] - beta[0];
    }
}